

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-debug.cpp
# Opt level: O1

void __thiscall
wasm::Debug::AddrExprMap::add(AddrExprMap *this,Expression *expr,DelimiterLocations *delimiter)

{
  bool bVar1;
  uint *puVar2;
  size_type sVar3;
  mapped_type *pmVar4;
  size_t i;
  ulong uVar5;
  
  if (((long)(delimiter->super_SmallVector<unsigned_int,_1UL>).flexible.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(delimiter->super_SmallVector<unsigned_int,_1UL>).flexible.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start >> 2) +
      (delimiter->super_SmallVector<unsigned_int,_1UL>).usedFixed != 0) {
    i = 0;
    uVar5 = 1;
    do {
      puVar2 = ZeroInitSmallVector<unsigned_int,_1UL>::operator[](delimiter,i);
      if (*puVar2 != 0) {
        puVar2 = ZeroInitSmallVector<unsigned_int,_1UL>::operator[](delimiter,i);
        sVar3 = std::
                _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Debug::AddrExprMap::DelimiterInfo>,_std::allocator<std::pair<const_unsigned_int,_wasm::Debug::AddrExprMap::DelimiterInfo>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::count(&(this->delimiterMap)._M_h,puVar2);
        if (sVar3 != 0) {
          __assert_fail("delimiterMap.count(delimiter[i]) == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-debug.cpp"
                        ,0x1a9,
                        "void wasm::Debug::AddrExprMap::add(Expression *, const BinaryLocations::DelimiterLocations &)"
                       );
        }
        puVar2 = ZeroInitSmallVector<unsigned_int,_1UL>::operator[](delimiter,i);
        pmVar4 = std::__detail::
                 _Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Debug::AddrExprMap::DelimiterInfo>,_std::allocator<std::pair<const_unsigned_int,_wasm::Debug::AddrExprMap::DelimiterInfo>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Debug::AddrExprMap::DelimiterInfo>,_std::allocator<std::pair<const_unsigned_int,_wasm::Debug::AddrExprMap::DelimiterInfo>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&this->delimiterMap,puVar2);
        pmVar4->expr = expr;
        pmVar4->id = i;
      }
      bVar1 = uVar5 < ((long)(delimiter->super_SmallVector<unsigned_int,_1UL>).flexible.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish -
                       (long)(delimiter->super_SmallVector<unsigned_int,_1UL>).flexible.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start >> 2) +
                      (delimiter->super_SmallVector<unsigned_int,_1UL>).usedFixed;
      i = uVar5;
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (bVar1);
  }
  return;
}

Assistant:

void add(Expression* expr,
           const BinaryLocations::DelimiterLocations& delimiter) {
    for (Index i = 0; i < delimiter.size(); i++) {
      if (delimiter[i] != 0) {
        assert(delimiterMap.count(delimiter[i]) == 0);
        delimiterMap[delimiter[i]] = DelimiterInfo{expr, i};
      }
    }
  }